

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cpp
# Opt level: O2

void YAML::QueueUnicodeCodepoint(deque<char,_std::allocator<char>_> *q,unsigned_long ch)

{
  char *__args;
  byte bVar1;
  ulong uVar2;
  char local_1a [10];
  
  uVar2 = 0xfffd;
  if (ch != 4) {
    uVar2 = ch;
  }
  if (uVar2 < 0x80) {
    __args = local_1a + 9;
  }
  else {
    bVar1 = (byte)uVar2;
    if (uVar2 < 0x800) {
      local_1a[8] = (byte)(uVar2 >> 6) | 0xc0;
      std::deque<char,_std::allocator<char>_>::emplace_back<char>(q,local_1a + 8);
      uVar2 = (ulong)(bVar1 & 0x3f | 0x80);
      __args = local_1a + 7;
    }
    else if (uVar2 < 0x10000) {
      local_1a[6] = (byte)((uint)uVar2 >> 0xc) | 0xe0;
      std::deque<char,_std::allocator<char>_>::emplace_back<char>(q,local_1a + 6);
      local_1a[5] = (byte)(uVar2 >> 6) & 0x3f | 0x80;
      std::deque<char,_std::allocator<char>_>::emplace_back<char>(q,local_1a + 5);
      uVar2 = (ulong)(bVar1 & 0x3f | 0x80);
      __args = local_1a + 4;
    }
    else {
      local_1a[3] = (byte)((uint)uVar2 >> 0x12) & 7 | 0xf0;
      std::deque<char,_std::allocator<char>_>::emplace_back<char>(q,local_1a + 3);
      local_1a[2] = (byte)(uVar2 >> 0xc) & 0x3f | 0x80;
      std::deque<char,_std::allocator<char>_>::emplace_back<char>(q,local_1a + 2);
      local_1a[1] = (byte)(uVar2 >> 6) & 0x3f | 0x80;
      std::deque<char,_std::allocator<char>_>::emplace_back<char>(q,local_1a + 1);
      uVar2 = (ulong)(bVar1 & 0x3f | 0x80);
      __args = local_1a;
    }
  }
  *__args = (char)uVar2;
  std::deque<char,_std::allocator<char>_>::emplace_back<char>(q,__args);
  return;
}

Assistant:

inline void QueueUnicodeCodepoint(std::deque<char>& q, unsigned long ch) {
  // We are not allowed to queue the Stream::eof() codepoint, so
  // replace it with CP_REPLACEMENT_CHARACTER
  if (static_cast<unsigned long>(Stream::eof()) == ch) {
    ch = CP_REPLACEMENT_CHARACTER;
  }

  if (ch < 0x80) {
    q.push_back(Utf8Adjust(ch, 0, 0));
  } else if (ch < 0x800) {
    q.push_back(Utf8Adjust(ch, 2, 6));
    q.push_back(Utf8Adjust(ch, 1, 0));
  } else if (ch < 0x10000) {
    q.push_back(Utf8Adjust(ch, 3, 12));
    q.push_back(Utf8Adjust(ch, 1, 6));
    q.push_back(Utf8Adjust(ch, 1, 0));
  } else {
    q.push_back(Utf8Adjust(ch, 4, 18));
    q.push_back(Utf8Adjust(ch, 1, 12));
    q.push_back(Utf8Adjust(ch, 1, 6));
    q.push_back(Utf8Adjust(ch, 1, 0));
  }
}